

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::Log<int&,int&>(LogLevel level,char *file,int line,char *fmt,int *args,int *args_1)

{
  string s;
  char *in_stack_00000098;
  int in_stack_000000a4;
  char *in_stack_000000a8;
  LogLevel in_stack_000000b4;
  int *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  StringPrintf<int&,int&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::c_str();
  Log(in_stack_000000b4,in_stack_000000a8,in_stack_000000a4,in_stack_00000098);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

inline void Log(LogLevel level, const char *file, int line, const char *fmt,
                Args &&...args) {
#ifdef PBRT_IS_GPU_CODE
    Log(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    Log(level, file, line, s.c_str());
#endif
}